

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void prvTidyReportMarkupVersion(TidyDocImpl *doc)

{
  uint vers_00;
  Bool BVar1;
  ctmbstr local_20;
  ctmbstr vers;
  uint apparentVers;
  Bool isXhtml;
  TidyDocImpl *doc_local;
  
  if (doc->givenDoctype != (tmbstr)0x0) {
    prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x278,doc->givenDoctype);
  }
  if ((int)(doc->config).value[0x67].v == 0) {
    BVar1 = doc->lexer->isvoyager;
    vers_00 = prvTidyApparentVersion(doc);
    local_20 = prvTidyHTMLVersionNameFromCode(vers_00,BVar1);
    if (local_20 == (ctmbstr)0x0) {
      local_20 = tidyLocalizedString(0x1fb);
    }
    prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x276,local_20);
    BVar1 = prvTidyWarnMissingSIInEmittedDocType(doc);
    if (BVar1 != no) {
      prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x27b);
    }
  }
  return;
}

Assistant:

void TY_(ReportMarkupVersion)( TidyDocImpl* doc )
{
    if ( doc->givenDoctype )
        TY_(Report)( doc, NULL, NULL, STRING_DOCTYPE_GIVEN, doc->givenDoctype );

    if ( ! cfgBool(doc, TidyXmlTags) )
    {
        Bool isXhtml = doc->lexer->isvoyager;
        uint apparentVers = TY_(ApparentVersion)( doc );
        ctmbstr vers = TY_(HTMLVersionNameFromCode)( apparentVers, isXhtml );

        if ( !vers )
            vers = tidyLocalizedString(STRING_HTML_PROPRIETARY);

        TY_(Report)( doc, NULL, NULL, STRING_CONTENT_LOOKS, vers );

        /* Warn about missing system identifier (SI) in emitted doctype */
        if ( TY_(WarnMissingSIInEmittedDocType)( doc ) )
            TY_(Report)( doc, NULL, NULL, STRING_NO_SYSID );
    }
}